

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcPile::~IfcPile(IfcPile *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  pointer pcVar3;
  undefined1 *puVar4;
  
  *(undefined8 *)this = 0x8a2850;
  *(undefined8 *)&this->field_0x1a0 = 0x8a2968;
  *(undefined8 *)&this->field_0x88 = 0x8a2878;
  *(undefined8 *)&this->field_0x98 = 0x8a28a0;
  *(undefined8 *)&this->field_0xd0 = 0x8a28c8;
  *(undefined8 *)&this->field_0x100 = 0x8a28f0;
  *(undefined8 *)&this->field_0x138 = 0x8a2918;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPile,_2UL>)._vptr_ObjectHelper =
       (_func_int **)0x8a2940;
  pcVar3 = (this->ConstructionType).ptr._M_dataplus._M_p;
  paVar1 = &(this->ConstructionType).ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  puVar4 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPile,_2UL>).field_0x10;
  puVar2 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPile,_2UL>).field_0x20;
  if (puVar4 != puVar2) {
    operator_delete(puVar4,*(long *)puVar2 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)this,&PTR_construction_vtable_24__008a2988);
  operator_delete(this,0x1b8);
  return;
}

Assistant:

IfcPile() : Object("IfcPile") {}